

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parse_error * __thiscall
nlohmann::detail::parse_error::position_string_abi_cxx11_(parse_error *this,position_t *pos)

{
  __cxx11 local_a8 [48];
  __cxx11 local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  position_t *local_18;
  position_t *pos_local;
  
  local_18 = pos;
  pos_local = (position_t *)this;
  std::__cxx11::to_string(local_78,pos->lines_read + 1);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" at line ");
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::to_string(local_a8,local_18->chars_read_current_line);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,local_38)
  ;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_78);
  return this;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return " at line " + std::to_string(pos.lines_read + 1) +
               ", column " + std::to_string(pos.chars_read_current_line);
    }